

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_nullddi.cpp
# Opt level: O2

ze_result_t
driver::zeCommandListImmediateGetIndex
          (ze_command_list_handle_t hCommandListImmediate,uint32_t *pIndex)

{
  ze_result_t zVar1;
  
  if (DAT_0010d410 != (code *)0x0) {
    zVar1 = (*DAT_0010d410)();
    return zVar1;
  }
  return ZE_RESULT_SUCCESS;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zeCommandListImmediateGetIndex(
        ze_command_list_handle_t hCommandListImmediate, ///< [in] handle of the immediate command list
        uint32_t* pIndex                                ///< [out] command queue index within the group to which the immediate
                                                        ///< command list is submitted
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // if the driver has created a custom function, then call it instead of using the generic path
        auto pfnImmediateGetIndex = context.zeDdiTable.CommandList.pfnImmediateGetIndex;
        if( nullptr != pfnImmediateGetIndex )
        {
            result = pfnImmediateGetIndex( hCommandListImmediate, pIndex );
        }
        else
        {
            // generic implementation
        }

        return result;
    }